

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderInvarianceRule2Test::getIterationProperties
          (TessellationShaderInvarianceRule2Test *this,uint n_iteration,float *out_inner_tess_levels
          ,float *out_outer_tess_levels,bool *out_point_mode,
          _tessellation_primitive_mode *out_primitive_mode,
          _tessellation_shader_vertex_ordering *out_vertex_ordering,uint *out_result_buffer_size)

{
  uint uVar1;
  TestError *this_00;
  _tessellation_primitive_mode *out_primitive_mode_local;
  bool *out_point_mode_local;
  float *out_outer_tess_levels_local;
  float *out_inner_tess_levels_local;
  uint n_iteration_local;
  TessellationShaderInvarianceRule2Test *this_local;
  
  *out_vertex_ordering = TESSELLATION_SHADER_VERTEX_ORDERING_CCW;
  if (n_iteration < 2) {
    *out_outer_tess_levels = 2.0;
    out_outer_tess_levels[1] = 3.0;
    out_outer_tess_levels[2] = 4.0;
    if (n_iteration == 0) {
      *out_inner_tess_levels = 4.0;
      out_inner_tess_levels[1] = 5.0;
    }
    else {
      *out_inner_tess_levels = 3.0;
      out_inner_tess_levels[1] = 4.0;
    }
    *out_point_mode = false;
    *out_primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
  }
  else {
    if (1 < n_iteration - 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized iteration index",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                 ,0x445);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    *out_outer_tess_levels = 2.0;
    out_outer_tess_levels[1] = 3.0;
    out_outer_tess_levels[2] = 4.0;
    out_outer_tess_levels[3] = 5.0;
    if (n_iteration == 2) {
      *out_inner_tess_levels = 2.0;
      out_inner_tess_levels[1] = 3.0;
    }
    else {
      *out_inner_tess_levels = 4.0;
      out_inner_tess_levels[1] = 5.0;
    }
    *out_point_mode = false;
    *out_primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
  }
  if (out_result_buffer_size != (uint *)0x0) {
    uVar1 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                      ((this->super_TessellationShaderInvarianceBaseTest).m_utils_ptr,
                       *out_primitive_mode,out_inner_tess_levels,out_outer_tess_levels,
                       TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,(bool)(*out_point_mode & 1));
    *out_result_buffer_size = uVar1;
    this->m_n_tessellated_vertices[n_iteration] = *out_result_buffer_size;
    *out_result_buffer_size = *out_result_buffer_size * 0xc;
  }
  return;
}

Assistant:

void TessellationShaderInvarianceRule2Test::getIterationProperties(
	unsigned int n_iteration, float* out_inner_tess_levels, float* out_outer_tess_levels, bool* out_point_mode,
	_tessellation_primitive_mode* out_primitive_mode, _tessellation_shader_vertex_ordering* out_vertex_ordering,
	unsigned int* out_result_buffer_size)
{
	*out_vertex_ordering = TESSELLATION_SHADER_VERTEX_ORDERING_CCW;

	switch (n_iteration)
	{
	case 0:
	case 1:
	{
		/* Triangles */
		out_outer_tess_levels[0] = 2.0f;
		out_outer_tess_levels[1] = 3.0f;
		out_outer_tess_levels[2] = 4.0f;

		if (n_iteration == 0)
		{
			out_inner_tess_levels[0] = 4.0f;
			out_inner_tess_levels[1] = 5.0f;
		}
		else
		{
			out_inner_tess_levels[0] = 3.0f;
			out_inner_tess_levels[1] = 4.0f;
		}

		*out_point_mode		= false;
		*out_primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;

		break;
	}

	case 2:
	case 3:
	{
		/* Quads */
		out_outer_tess_levels[0] = 2.0f;
		out_outer_tess_levels[1] = 3.0f;
		out_outer_tess_levels[2] = 4.0f;
		out_outer_tess_levels[3] = 5.0f;

		if (n_iteration == 2)
		{
			out_inner_tess_levels[0] = 2.0f;
			out_inner_tess_levels[1] = 3.0f;
		}
		else
		{
			out_inner_tess_levels[0] = 4.0f;
			out_inner_tess_levels[1] = 5.0f;
		}

		*out_point_mode		= false;
		*out_primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized iteration index");
	}
	}

	if (out_result_buffer_size != DE_NULL)
	{
		*out_result_buffer_size = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
			*out_primitive_mode, out_inner_tess_levels, out_outer_tess_levels, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
			*out_point_mode);

		m_n_tessellated_vertices[n_iteration] = *out_result_buffer_size;
		*out_result_buffer_size =
			static_cast<unsigned int>(*out_result_buffer_size * 3 /* components */ * sizeof(float));

		DE_ASSERT(*out_result_buffer_size != 0);
	}
}